

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

void memory_tree_ns::finish(memory_tree *b)

{
  node *pnVar1;
  example **ppeVar2;
  size_t i;
  ulong uVar3;
  size_t i_1;
  long lVar4;
  
  lVar4 = 0x28;
  for (uVar3 = 0; pnVar1 = (b->nodes)._begin,
      uVar3 < (ulong)(((long)(b->nodes)._end - (long)pnVar1) / 0x48); uVar3 = uVar3 + 1) {
    v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)((long)&pnVar1->parent + lVar4));
    lVar4 = lVar4 + 0x48;
  }
  v_array<memory_tree_ns::node>::delete_v(&b->nodes);
  for (uVar3 = 0; ppeVar2 = (b->examples)._begin,
      uVar3 < (ulong)((long)(b->examples)._end - (long)ppeVar2 >> 3); uVar3 = uVar3 + 1) {
    free_example(ppeVar2[uVar3]);
  }
  v_array<example_*>::delete_v(&b->examples);
  free_example(b->kprod_ec);
  return;
}

Assistant:

void finish(memory_tree& b)
    {
        for (size_t i = 0; i < b.nodes.size(); ++i)
            b.nodes[i].examples_index.delete_v();
        b.nodes.delete_v();
        for (size_t i = 0; i < b.examples.size(); i++)
            free_example(b.examples[i]);
        b.examples.delete_v();
        free_example(b.kprod_ec);
        //cout<<b.max_nodes<<endl;
        //cout<<b.construct_time<<" "<<b.test_time<<endl;
    }